

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

Mat * ncnn::Mat::from_pixels_resize
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                int target_width,int target_height,Allocator *allocator)

{
  Mat dst;
  
  if (h == target_height && w == target_width) {
    from_pixels(__return_storage_ptr__,pixels,type,w,h,stride,allocator);
  }
  else {
    if ((type & 0xffffU) - 1 < 2) {
      Mat(&dst,target_width,target_height,3,3,(Allocator *)0x0);
      resize_bilinear_c3(pixels,w,h,stride,(uchar *)dst.data,target_width,target_height,
                         target_width * 3);
      from_pixels(__return_storage_ptr__,(uchar *)dst.data,type,target_width,target_height,allocator
                 );
    }
    else if ((type & 0xffffU) == 3) {
      Mat(&dst,target_width,target_height,1,1,(Allocator *)0x0);
      resize_bilinear_c1(pixels,w,h,stride,(uchar *)dst.data,target_width,target_height,target_width
                        );
      from_pixels(__return_storage_ptr__,(uchar *)dst.data,type,target_width,target_height,allocator
                 );
    }
    else {
      if ((type & 0xfffeU) != 4) {
        fprintf(_stderr,"unknown convert type %d",(ulong)(uint)type);
        fputc(10,_stderr);
        __return_storage_ptr__->cstep = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->d = 0;
        __return_storage_ptr__->c = 0;
        return __return_storage_ptr__;
      }
      Mat(&dst,target_width,target_height,4,4,(Allocator *)0x0);
      resize_bilinear_c4(pixels,w,h,stride,(uchar *)dst.data,target_width,target_height,
                         target_width * 4);
      from_pixels(__return_storage_ptr__,(uchar *)dst.data,type,target_width,target_height,allocator
                 );
    }
    ~Mat(&dst);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int stride, int target_width, int target_height, Allocator* allocator)
{
    if (w == target_width && h == target_height)
        return Mat::from_pixels(pixels, type, w, h, stride, allocator);

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        Mat dst(target_width, target_height, (size_t)3u, 3);
        resize_bilinear_c3(pixels, w, h, stride, dst, target_width, target_height, target_width * 3);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        Mat dst(target_width, target_height, (size_t)1u, 1);
        resize_bilinear_c1(pixels, w, h, stride, dst, target_width, target_height, target_width * 1);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        Mat dst(target_width, target_height, (size_t)4u, 4);
        resize_bilinear_c4(pixels, w, h, stride, dst, target_width, target_height, target_width * 4);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}